

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# code_generator.cc
# Opt level: O3

bool __thiscall
google::protobuf::compiler::CodeGenerator::GenerateAll
          (CodeGenerator *this,
          vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
          *files,string *parameter,GeneratorContext *generator_context,string *error)

{
  FileDescriptor *pFVar1;
  long lVar2;
  int iVar3;
  pointer ppFVar4;
  long *plVar5;
  long *plVar6;
  char cVar7;
  ulong uVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  long *local_80 [2];
  long local_70 [2];
  string *local_60;
  GeneratorContext *local_58;
  long *local_50;
  long local_48;
  long local_40;
  long lStack_38;
  
  ppFVar4 = (files->
            super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
            )._M_impl.super__Vector_impl_data._M_start;
  if ((files->
      super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
      )._M_impl.super__Vector_impl_data._M_finish == ppFVar4) {
    cVar7 = '\x01';
  }
  else {
    uVar8 = 0;
    local_60 = parameter;
    local_58 = generator_context;
    do {
      pFVar1 = ppFVar4[uVar8];
      iVar3 = (*this->_vptr_CodeGenerator[2])(this,pFVar1,local_60,local_58,error);
      cVar7 = (char)iVar3;
      if ((error == (string *)0x0) || (cVar7 != '\0')) {
        if (error != (string *)0x0) goto LAB_00201139;
      }
      else {
        if (error->_M_string_length != 0) goto LAB_0020116b;
        std::__cxx11::string::_M_replace((ulong)error,0,(char *)0x0,0x34d1d4);
LAB_00201139:
        if (error->_M_string_length != 0) {
LAB_0020116b:
          plVar5 = *(long **)pFVar1;
          lVar2 = *plVar5;
          local_80[0] = local_70;
          std::__cxx11::string::_M_construct<char*>((string *)local_80,lVar2,plVar5[1] + lVar2);
          std::__cxx11::string::append((char *)local_80);
          plVar5 = (long *)std::__cxx11::string::_M_append
                                     ((char *)local_80,(ulong)(error->_M_dataplus)._M_p);
          plVar6 = plVar5 + 2;
          if ((long *)*plVar5 == plVar6) {
            local_40 = *plVar6;
            lStack_38 = plVar5[3];
            local_50 = &local_40;
          }
          else {
            local_40 = *plVar6;
            local_50 = (long *)*plVar5;
          }
          local_48 = plVar5[1];
          *plVar5 = (long)plVar6;
          plVar5[1] = 0;
          *(undefined1 *)(plVar5 + 2) = 0;
          std::__cxx11::string::operator=((string *)error,(string *)&local_50);
          if (local_50 != &local_40) {
            operator_delete(local_50,local_40 + 1);
          }
          if (local_80[0] == local_70) {
            return (bool)cVar7;
          }
          operator_delete(local_80[0],local_70[0] + 1);
          return (bool)cVar7;
        }
      }
      if (cVar7 == '\0') {
        return false;
      }
      uVar8 = uVar8 + 1;
      ppFVar4 = (files->
                super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                )._M_impl.super__Vector_impl_data._M_start;
    } while (uVar8 < (ulong)((long)(files->
                                   super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                                   )._M_impl.super__Vector_impl_data._M_finish - (long)ppFVar4 >> 3)
            );
  }
  return (bool)cVar7;
}

Assistant:

bool CodeGenerator::GenerateAll(
    const std::vector<const FileDescriptor*>& files,
    const string& parameter,
    GeneratorContext* generator_context,
    string* error) const {
  // Default implemenation is just to call the per file method, and prefix any
  // error string with the file to provide context.
  bool succeeded = true;
  for (int i = 0; i < files.size(); i++) {
    const FileDescriptor* file = files[i];
    succeeded = Generate(file, parameter, generator_context, error);
    if (!succeeded && error && error->empty()) {
      *error = "Code generator returned false but provided no error "
               "description.";
    }
    if (error && !error->empty()) {
      *error = file->name() + ": " + *error;
      break;
    }
    if (!succeeded) {
      break;
    }
  }
  return succeeded;
}